

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O2

result_type_conflict utility::get_random<unsigned_long>(unsigned_long min,unsigned_long max)

{
  int iVar1;
  result_type_conflict rVar2;
  ulong uVar3;
  
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&get_random<unsigned_long>::rd);
      __cxa_atexit(std::random_device::~random_device,&get_random<unsigned_long>::rd,&__dso_handle);
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rd);
    }
  }
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::engine == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::engine);
    if (iVar1 != 0) {
      uVar3 = std::random_device::_M_getval();
      iVar1 = (int)((uVar3 & 0xffffffff) % 0x7fffffff);
      get_random<unsigned_long>::engine._M_x = (unsigned_long)(iVar1 + (uint)(iVar1 == 0));
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::engine);
    }
  }
  if (get_random<unsigned_long>(unsigned_long,unsigned_long)::rand == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rand);
    if (iVar1 != 0) {
      get_random<unsigned_long>::rand._M_param._M_a = min;
      get_random<unsigned_long>::rand._M_param._M_b = max;
      __cxa_guard_release(&get_random<unsigned_long>(unsigned_long,unsigned_long)::rand);
    }
  }
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&get_random<unsigned_long>::rand,&get_random<unsigned_long>::engine);
  return rVar2;
}

Assistant:

auto get_random(T min = 0, T max = std::numeric_limits<std::uint64_t>::max()) {
  static std::random_device rd;
  static std::default_random_engine engine(rd());
  static std::uniform_int_distribution<std::uint64_t> rand(min, max);
  return rand(engine);
}